

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

Value * __thiscall
kj::_::Debug::
ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:728:9)>
::evaluate(Value *__return_storage_ptr__,
          ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:728:9)>
          *this)

{
  anon_class_24_3_35e21e8f *paVar1;
  unsigned_long *in_R9;
  String local_28;
  
  paVar1 = this->func;
  makeDescription<unsigned_long&,unsigned_long&,unsigned_long&>
            (&local_28,(Debug *)"inputSize, blockSize, limit",(char *)paVar1->inputSize,
             paVar1->blockSize,paVar1->limit,in_R9);
  __return_storage_ptr__->file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  __return_storage_ptr__->line = 0x2d8;
  (__return_storage_ptr__->description).content.ptr = local_28.content.ptr;
  (__return_storage_ptr__->description).content.size_ = local_28.content.size_;
  (__return_storage_ptr__->description).content.disposer = local_28.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

Value evaluate() override {
      return func();
    }